

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O2

void jump(ch_context *context,ch_jmpptr offset)

{
  uint8_t *puVar1;
  
  puVar1 = context->pcurrent + offset;
  if ((context->pstart <= puVar1) && (puVar1 < context->pend)) {
    context->pcurrent = puVar1;
    return;
  }
  ch_runtime_error(context,EXIT_INVALID_INSTRUCTION_POINTER,
                   "Jump pointer exceeds bounds of program.");
  return;
}

Assistant:

static void jump(ch_context *context, ch_jmpptr offset) {
  uint8_t *jump_ptr = context->pcurrent + offset;
  if (!IS_PROGRAM_PTR_SAFE(context, jump_ptr)) {
    ch_runtime_error(context, EXIT_INVALID_INSTRUCTION_POINTER,
                     "Jump pointer exceeds bounds of program.");
    return;
  }

  context->pcurrent = jump_ptr;
}